

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O3

pair<bool,_unsigned_long> __thiscall
IdentifierTokenizerRule::tryMatch(IdentifierTokenizerRule *this,shared_ptr<Readable> *reader)

{
  element_type *peVar1;
  char cVar2;
  int iVar3;
  unsigned_long uVar4;
  ulong unaff_R15;
  pair<bool,_unsigned_long> pVar5;
  
  peVar1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar3 = (*peVar1->_vptr_Readable[2])(peVar1,0);
  cVar2 = (char)iVar3;
  if (((byte)(cVar2 + 0x9fU) < 0x1a) || (cVar2 == '_' || (byte)(cVar2 + 0xbfU) < 0x1a)) {
    uVar4 = 1;
    while( true ) {
      peVar1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar3 = (*peVar1->_vptr_Readable[2])(peVar1,uVar4);
      unaff_R15 = CONCAT71((int7)(unaff_R15 >> 8),1);
      if ((char)iVar3 == '\0') break;
      peVar1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar3 = (*peVar1->_vptr_Readable[2])(peVar1,uVar4);
      cVar2 = (char)iVar3;
      if ((0x19 < (byte)(cVar2 + 0x9fU)) &&
         ((9 < (byte)(cVar2 - 0x30U) && 0x19 < (byte)(cVar2 + 0xbfU)) && cVar2 != '_')) break;
      uVar4 = uVar4 + 1;
    }
  }
  else {
    unaff_R15 = 0;
    uVar4 = 0;
  }
  pVar5._0_8_ = unaff_R15 & 0xffffffff;
  pVar5.second = uVar4;
  return pVar5;
}

Assistant:

std::pair<bool, std::size_t> tryMatch(std::shared_ptr<Readable> reader) noexcept override {
    std::size_t i = 0;

    if (!isLiteralFirst(reader->charAt(i))) {
      return std::make_pair(false, 0);
    }

    i++;

    for (; reader->charAt(i) != '\0'; i++) {
      if (!isLiteralRest(reader->charAt(i))) {
        break;
      }
    }

    return std::make_pair(true, i);
  }